

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

bool __thiscall
QWidgetTextControlPrivate::sendMouseEventToInputContext
          (QWidgetTextControlPrivate *this,QEvent *e,Type eventType,MouseButton button,QPointF *pos,
          KeyboardModifiers modifiers,MouseButtons buttons,QPoint *globalPos)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Action AVar5;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  plVar1 = *(long **)&this->field_0x8;
  bVar2 = isPreediting(this);
  if (bVar2) {
    QTextCursor::block();
    QTextBlock::layout();
    iVar3 = (**(code **)(*plVar1 + 0x78))(plVar1,pos,1);
    iVar4 = QTextCursor::position();
    if (-1 < iVar3 - iVar4) {
      QTextLayout::preeditAreaText();
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      if ((ulong)(uint)(iVar3 - iVar4) <= (ulong)local_50.size) {
        if (eventType == MouseButtonRelease) {
          AVar5 = QGuiApplication::inputMethod();
          QInputMethod::invokeAction(AVar5,0);
        }
        (**(code **)(*(long *)e + 0x10))(e,1);
        bVar2 = true;
        goto LAB_00480638;
      }
    }
  }
  bVar2 = false;
LAB_00480638:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetTextControlPrivate::sendMouseEventToInputContext(
        QEvent *e, QEvent::Type eventType, Qt::MouseButton button, const QPointF &pos,
        Qt::KeyboardModifiers modifiers, Qt::MouseButtons buttons, const QPoint &globalPos)
{
    Q_UNUSED(eventType);
    Q_UNUSED(button);
    Q_UNUSED(pos);
    Q_UNUSED(modifiers);
    Q_UNUSED(buttons);
    Q_UNUSED(globalPos);
#if !defined(QT_NO_IM)
    Q_Q(QWidgetTextControl);

    if (isPreediting()) {
        QTextLayout *layout = cursor.block().layout();
        int cursorPos = q->hitTest(pos, Qt::FuzzyHit) - cursor.position();

        if (cursorPos < 0 || cursorPos > layout->preeditAreaText().size())
            cursorPos = -1;

        if (cursorPos >= 0) {
            if (eventType == QEvent::MouseButtonRelease)
                QGuiApplication::inputMethod()->invokeAction(QInputMethod::Click, cursorPos);

            e->setAccepted(true);
            return true;
        }
    }
#else
    Q_UNUSED(e);
#endif
    return false;
}